

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O1

void __thiscall
leveldb::_Test_L0_CompactionBug_Issue44_a::_Run(_Test_L0_CompactionBug_Issue44_a *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Env *pEVar2;
  Status local_230;
  string local_228;
  Status local_208 [2];
  undefined8 local_1f8;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined1 local_1e8 [16];
  uint local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  Tester local_1c8;
  
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1c8.line_ = 0x5ae;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  paVar1 = &local_228.field_2;
  local_228._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"b","");
  local_1f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"v","");
  local_208[0].state_ = local_228._M_dataplus._M_p;
  local_1d8 = (uint)local_1f8;
  uStack_1d4 = local_1f8._4_4_;
  uStack_1d0 = uStack_1f0;
  uStack_1cc = uStack_1ec;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_230);
  test::Tester::IsOk(&local_1c8,&local_230);
  if (local_230.state_ != (char *)0x0) {
    operator_delete__(local_230.state_);
  }
  if (local_1f8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8) {
    operator_delete(local_1f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1c8);
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1c8.line_ = 0x5b0;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  local_228._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"b","");
  local_1d8 = local_1d8 & 0xffffff00;
  local_1f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p;
  uStack_1f0 = (undefined4)local_228._M_string_length;
  uStack_1ec = local_228._M_string_length._4_4_;
  (*((this->super_DBTest).db_)->_vptr_DB[3])(local_208);
  test::Tester::IsOk(&local_1c8,local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208[0].state_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete__(local_208[0].state_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1c8);
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1c8.line_ = 0x5b1;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  local_228._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"a","");
  local_1d8 = local_1d8 & 0xffffff00;
  local_1f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p;
  uStack_1f0 = (undefined4)local_228._M_string_length;
  uStack_1ec = local_228._M_string_length._4_4_;
  (*((this->super_DBTest).db_)->_vptr_DB[3])(local_208);
  test::Tester::IsOk(&local_1c8,local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208[0].state_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete__(local_208[0].state_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1c8);
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1c8.line_ = 0x5b3;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  local_228._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"a","");
  local_1d8 = local_1d8 & 0xffffff00;
  local_1f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p;
  uStack_1f0 = (undefined4)local_228._M_string_length;
  uStack_1ec = local_228._M_string_length._4_4_;
  (*((this->super_DBTest).db_)->_vptr_DB[3])(local_208);
  test::Tester::IsOk(&local_1c8,local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208[0].state_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete__(local_208[0].state_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1c8);
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1c8.line_ = 0x5b5;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  local_228._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"a","");
  local_1f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"v","");
  local_208[0].state_ = local_228._M_dataplus._M_p;
  local_1d8 = (uint)local_1f8;
  uStack_1d4 = local_1f8._4_4_;
  uStack_1d0 = uStack_1f0;
  uStack_1cc = uStack_1ec;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_230);
  test::Tester::IsOk(&local_1c8,&local_230);
  if (local_230.state_ != (char *)0x0) {
    operator_delete__(local_230.state_);
  }
  if (local_1f8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8) {
    operator_delete(local_1f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1c8);
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1c8.line_ = 0x5b8;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  DBTest::Contents_abi_cxx11_(&local_228,&this->super_DBTest);
  test::Tester::IsEq<char[7],std::__cxx11::string>(&local_1c8,(char (*) [7])"(a->v)",&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1c8);
  pEVar2 = Env::Default();
  (*pEVar2->_vptr_Env[0x14])(pEVar2,1000000);
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1c8.line_ = 0x5ba;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  DBTest::Contents_abi_cxx11_(&local_228,&this->super_DBTest);
  test::Tester::IsEq<char[7],std::__cxx11::string>(&local_1c8,(char (*) [7])"(a->v)",&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1c8);
  return;
}

Assistant:

TEST(DBTest, L0_CompactionBug_Issue44_a) {
  Reopen();
  ASSERT_OK(Put("b", "v"));
  Reopen();
  ASSERT_OK(Delete("b"));
  ASSERT_OK(Delete("a"));
  Reopen();
  ASSERT_OK(Delete("a"));
  Reopen();
  ASSERT_OK(Put("a", "v"));
  Reopen();
  Reopen();
  ASSERT_EQ("(a->v)", Contents());
  DelayMilliseconds(1000);  // Wait for compaction to finish
  ASSERT_EQ("(a->v)", Contents());
}